

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

void writesf_dsp(t_writesf *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  t_signal *ptVar4;
  long lVar5;
  
  lVar5 = (long)(x->x_sf).sf_nchannels;
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  ptVar4 = *sp;
  iVar1 = ptVar4->s_n;
  iVar2 = (x->x_sf).sf_bytesperframe;
  x->x_vecsize = iVar1;
  x->x_sigperiod = x->x_fifosize / (iVar2 * iVar1 * 0x10);
  if (0 < lVar5) {
    lVar3 = 0;
    do {
      x->x_outvec[lVar3] = sp[lVar3]->s_vec;
      lVar3 = lVar3 + 1;
    } while (lVar5 != lVar3);
    ptVar4 = *sp;
  }
  x->x_insamplerate = ptVar4->s_sr;
  pthread_mutex_unlock((pthread_mutex_t *)&x->x_mutex);
  dsp_add(writesf_perform,1,x);
  return;
}

Assistant:

static void writesf_dsp(t_writesf *x, t_signal **sp)
{
    int i, ninlets = x->x_sf.sf_nchannels;
    pthread_mutex_lock(&x->x_mutex);
    x->x_vecsize = sp[0]->s_n;
    x->x_sigperiod = (x->x_fifosize /
            (16 * x->x_sf.sf_bytesperframe * x->x_vecsize));
    for (i = 0; i < ninlets; i++)
        x->x_outvec[i] = sp[i]->s_vec;
    x->x_insamplerate = sp[0]->s_sr;
    pthread_mutex_unlock(&x->x_mutex);
    dsp_add(writesf_perform, 1, x);
}